

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O1

void __thiscall QMdiSubWindowPrivate::_q_enterInteractiveMode(QMdiSubWindowPrivate *this)

{
  uint uVar1;
  QWidget *this_00;
  Data *pDVar2;
  QWidgetData *pQVar3;
  Representation RVar4;
  Representation RVar5;
  Representation RVar6;
  LayoutDirection LVar7;
  int iVar8;
  Representation RVar9;
  QObject *pQVar10;
  QStyle *pQVar11;
  QPoint QVar12;
  QObject *pQVar13;
  Representation RVar14;
  long in_FS_OFFSET;
  QPoint local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  QObject::sender();
  pQVar10 = (QObject *)QMetaObject::cast((QObject *)&QAction::staticMetaObject);
  if (pQVar10 == (QObject *)0x0) goto LAB_004533b1;
  local_38.xp.m_i = 0;
  local_38.yp.m_i = 0;
  pDVar2 = this->actions[1].wp.d;
  if (((pDVar2 == (Data *)0x0) || (*(int *)(pDVar2 + 4) == 0)) ||
     (this->actions[1].wp.value == (QObject *)0x0)) {
LAB_0045320e:
    pDVar2 = this->actions[2].wp.d;
    if (((pDVar2 == (Data *)0x0) || (*(int *)(pDVar2 + 4) == 0)) ||
       (this->actions[2].wp.value == (QObject *)0x0)) goto LAB_004533b1;
    if ((pDVar2 == (Data *)0x0) || (*(int *)(pDVar2 + 4) == 0)) {
      pQVar13 = (QObject *)0x0;
    }
    else {
      pQVar13 = this->actions[2].wp.value;
    }
    if (pQVar13 != pQVar10) goto LAB_004533b1;
    LVar7 = QWidget::layoutDirection(this_00);
    this->currentOperation = (LVar7 == LeftToRight) + BottomLeftResize;
    pQVar11 = QWidget::style(this_00);
    iVar8 = (**(code **)(*(long *)pQVar11 + 0xe0))(pQVar11,0x2c,0,this_00);
    iVar8 = iVar8 / 2;
    LVar7 = QWidget::layoutDirection(this_00);
    RVar14.m_i = iVar8;
    if (LVar7 == LeftToRight) {
      RVar14.m_i = ((this_00->data->crect).x2.m_i - ((this_00->data->crect).x1.m_i + iVar8)) + 1;
    }
    RVar9.m_i = ((this_00->data->crect).y2.m_i - (iVar8 + (this_00->data->crect).y1.m_i)) + 1;
  }
  else {
    if ((pDVar2 == (Data *)0x0) || (*(int *)(pDVar2 + 4) == 0)) {
      pQVar13 = (QObject *)0x0;
    }
    else {
      pQVar13 = this->actions[1].wp.value;
    }
    if (pQVar13 != pQVar10) goto LAB_0045320e;
    this->currentOperation = Move;
    iVar8 = (this_00->data->crect).x2.m_i - (this_00->data->crect).x1.m_i;
    RVar14.m_i = (iVar8 - (iVar8 + 1 >> 0x1f)) + 1 >> 1;
    iVar8 = titleBarHeight(this);
    RVar9.m_i = iVar8 + -1;
  }
  local_38.yp.m_i = RVar9.m_i;
  local_38.xp.m_i = RVar14.m_i;
  updateCursor(this);
  QWidget::cursor((QWidget *)&stack0xffffffffffffffc0);
  QVar12 = QWidget::mapToGlobal(this_00,&local_38);
  QCursor::setPos(QVar12.xp.m_i.m_i,QVar12.yp.m_i.m_i);
  QCursor::~QCursor((QCursor *)&stack0xffffffffffffffc0);
  QVar12 = QWidget::mapToParent(this_00,&local_38);
  this->mousePressPosition = QVar12;
  pQVar3 = this_00->data;
  RVar4.m_i = (pQVar3->crect).y1.m_i;
  RVar5.m_i = (pQVar3->crect).x2.m_i;
  RVar6.m_i = (pQVar3->crect).y2.m_i;
  (this->oldGeometry).x1 = (Representation)(pQVar3->crect).x1.m_i;
  (this->oldGeometry).y1 = (Representation)RVar4.m_i;
  (this->oldGeometry).x2 = (Representation)RVar5.m_i;
  (this->oldGeometry).y2 = (Representation)RVar6.m_i;
  this->isInInteractiveMode = true;
  QWidget::setFocus(this_00,OtherFocusReason);
  uVar1 = *(uint *)(*(long *)&this_00->field_0x8 + 0x388);
  if ((((uVar1 & 4) == 0) || ((this->currentOperation & ~Move) != BottomLeftResize)) &&
     (((uVar1 & 8) == 0 || (this->currentOperation != Move)))) {
    QWidget::grabMouse(this_00);
  }
  else {
    enterRubberBandMode(this);
  }
LAB_004533b1:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMdiSubWindowPrivate::_q_enterInteractiveMode()
{
#ifndef QT_NO_ACTION
    Q_Q(QMdiSubWindow);
    QAction *action = qobject_cast<QAction *>(q->sender());
    if (!action)
        return;

    QPoint pressPos;
    if (actions[MoveAction] && actions[MoveAction] == action) {
        currentOperation = Move;
        pressPos = QPoint(q->width() / 2, titleBarHeight() - 1);
    } else if (actions[ResizeAction] && actions[ResizeAction] == action) {
        currentOperation = q->isLeftToRight() ? BottomRightResize : BottomLeftResize;
        int offset = q->style()->pixelMetric(QStyle::PM_MdiSubWindowFrameWidth, nullptr, q) / 2;
        int x = q->isLeftToRight() ? q->width() - offset : offset;
        pressPos = QPoint(x, q->height() - offset);
    } else {
        return;
    }

    updateCursor();
#ifndef QT_NO_CURSOR
    q->cursor().setPos(q->mapToGlobal(pressPos));
#endif
    mousePressPosition = q->mapToParent(pressPos);
    oldGeometry = q->geometry();
    isInInteractiveMode = true;
    q->setFocus();
#if QT_CONFIG(rubberband)
    if ((q->testOption(QMdiSubWindow::RubberBandResize)
            && (currentOperation == BottomRightResize || currentOperation == BottomLeftResize))
            || (q->testOption(QMdiSubWindow::RubberBandMove) && currentOperation == Move)) {
        enterRubberBandMode();
    } else
#endif // QT_CONFIG(rubberband)
    {
        q->grabMouse();
    }
#endif // QT_NO_ACTION
}